

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  bool bVar1;
  char *pcVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  bVar1 = (bool)**(byte **)this;
  pcVar2 = "false";
  if ((ulong)bVar1 != 0) {
    pcVar2 = "true";
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,pcVar2,pcVar2 + ((ulong)bVar1 ^ 5));
  __return_storage_ptr__->passed = bVar1;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_40,local_38 + (long)local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }